

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscClass.c
# Opt level: O0

void Ssc_GiaClassesCheckPairs(Gia_Man_t *p,Vec_Int_t *vDisPairs)

{
  int iVar1;
  uint uVar2;
  uint Id;
  uint uVar3;
  int Result;
  int iObj;
  int iRepr;
  int i;
  Vec_Int_t *vDisPairs_local;
  Gia_Man_t *p_local;
  
  for (iObj = 0; iVar1 = Vec_IntSize(vDisPairs), iObj + 1 < iVar1; iObj = iObj + 2) {
    uVar2 = Vec_IntEntry(vDisPairs,iObj);
    Id = Vec_IntEntry(vDisPairs,iObj + 1);
    uVar3 = Gia_ObjRepr(p,Id);
    if (uVar2 == uVar3) {
      printf("Pair (%d, %d) are still equivalent.\n",(ulong)uVar2,(ulong)Id);
    }
  }
  return;
}

Assistant:

void Ssc_GiaClassesCheckPairs( Gia_Man_t * p, Vec_Int_t * vDisPairs )
{
    int i, iRepr, iObj, Result = 1;
    Vec_IntForEachEntryDouble( vDisPairs, iRepr, iObj, i )
        if ( iRepr == Gia_ObjRepr(p, iObj) )
            printf( "Pair (%d, %d) are still equivalent.\n", iRepr, iObj ), Result = 0;
//    if ( Result )
//        printf( "Classes are refined correctly.\n" );
}